

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

pair<unsigned_long,_bool> __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64Fallback(CodedInputStream *this)

{
  byte bVar1;
  int iVar2;
  pair<int,_bool> pVar3;
  undefined8 extraout_RDX;
  pair<bool,_const_unsigned_char_*> pVar4;
  pair<unsigned_long,_bool> pVar5;
  pair<unsigned_long,_bool> pVar6;
  bool local_a1;
  bool success;
  uint64 temp_1;
  bool local_86;
  bool local_85;
  int local_84;
  pair<int,_bool> local_80;
  byte local_78;
  pair<bool,_const_unsigned_char_*> p;
  uint64 temp;
  CodedInputStream *this_local;
  bool local_50;
  bool local_42;
  bool local_41;
  uint local_40;
  uint local_3c;
  uint32 part2;
  uint32 part1;
  uint32 part0;
  uint32 b;
  uint8 *ptr;
  byte *local_20;
  byte local_18;
  uint8 *local_10;
  
  iVar2 = BufferSize(this);
  if ((iVar2 < 10) &&
     ((this->buffer_end_ <= this->buffer_ || ((this->buffer_end_[-1] & 0x80) != 0)))) {
    local_a1 = ReadVarint64Slow(this,(uint64 *)&stack0xffffffffffffff60);
    pVar5 = std::make_pair<unsigned_long&,bool&>
                      ((unsigned_long *)&stack0xffffffffffffff60,&local_a1);
    local_50 = pVar5.second;
    goto LAB_0042a083;
  }
  local_20 = this->buffer_;
  ptr = (uint8 *)&p.second;
  local_3c = 0;
  local_40 = 0;
  _part0 = local_20 + 1;
  part2 = (uint32)*local_20;
  part1 = part2;
  if ((*local_20 & 0x80) == 0) {
LAB_00429f6b:
    p.second = (uchar *)((ulong)part2 | (ulong)local_3c << 0x1c | (ulong)local_40 << 0x38);
    local_42 = true;
    pVar4 = std::make_pair<bool,unsigned_char_const*&>(&local_42,(uchar **)&part0);
    local_10 = pVar4.second;
    local_18 = pVar4.first;
  }
  else {
    bVar1 = *_part0;
    part1 = (uint32)bVar1;
    part2 = part1 * 0x80 + (part2 - 0x80);
    _part0 = local_20 + 2;
    if ((bVar1 & 0x80) == 0) goto LAB_00429f6b;
    bVar1 = local_20[2];
    part1 = (uint32)bVar1;
    part2 = part1 * 0x4000 + (part2 - 0x4000);
    _part0 = local_20 + 3;
    if ((bVar1 & 0x80) == 0) goto LAB_00429f6b;
    bVar1 = local_20[3];
    part1 = (uint32)bVar1;
    part2 = part1 * 0x200000 + (part2 - 0x200000);
    _part0 = local_20 + 4;
    if ((bVar1 & 0x80) == 0) goto LAB_00429f6b;
    part2 = part2 + 0xf0000000;
    bVar1 = local_20[4];
    local_3c = (uint)bVar1;
    part1 = local_3c;
    _part0 = local_20 + 5;
    if ((bVar1 & 0x80) == 0) goto LAB_00429f6b;
    bVar1 = local_20[5];
    part1 = (uint32)bVar1;
    local_3c = part1 * 0x80 + (local_3c - 0x80);
    _part0 = local_20 + 6;
    if ((bVar1 & 0x80) == 0) goto LAB_00429f6b;
    bVar1 = local_20[6];
    part1 = (uint32)bVar1;
    local_3c = part1 * 0x4000 + (local_3c - 0x4000);
    _part0 = local_20 + 7;
    if ((bVar1 & 0x80) == 0) goto LAB_00429f6b;
    bVar1 = local_20[7];
    part1 = (uint32)bVar1;
    local_3c = part1 * 0x200000 + (local_3c - 0x200000);
    _part0 = local_20 + 8;
    if ((bVar1 & 0x80) == 0) goto LAB_00429f6b;
    local_3c = local_3c + 0xf0000000;
    bVar1 = local_20[8];
    local_40 = (uint)bVar1;
    part1 = local_40;
    _part0 = local_20 + 9;
    if ((bVar1 & 0x80) == 0) goto LAB_00429f6b;
    _part0 = local_20 + 10;
    bVar1 = local_20[9];
    part1 = (uint32)bVar1;
    local_40 = part1 * 0x80 + (local_40 - 0x80);
    if ((bVar1 & 0x80) == 0) goto LAB_00429f6b;
    local_41 = false;
    pVar4 = std::make_pair<bool,unsigned_char_const*&>(&local_41,(uchar **)&part0);
    local_10 = pVar4.second;
    local_18 = pVar4.first;
  }
  local_78 = local_18;
  p._0_8_ = local_10;
  if ((local_18 & 1) == 0) {
    local_84 = 0;
    local_85 = false;
    pVar3 = std::make_pair<int,bool>(&local_84,&local_85);
    local_80.first = pVar3.first;
    local_80.second = pVar3.second;
    std::pair<unsigned_long,_bool>::pair<int,_bool,_true>
              ((pair<unsigned_long,_bool> *)&this_local,&local_80);
    pVar5._8_8_ = extraout_RDX;
    pVar5.first = (unsigned_long)this_local;
  }
  else {
    this->buffer_ = local_10;
    local_86 = true;
    pVar5 = std::make_pair<unsigned_long&,bool>((unsigned_long *)&p.second,&local_86);
    local_50 = pVar5.second;
  }
LAB_0042a083:
  this_local = (CodedInputStream *)pVar5.first;
  pVar6._9_7_ = pVar5._9_7_;
  pVar6.second = local_50;
  pVar6.first = (unsigned_long)this_local;
  return pVar6;
}

Assistant:

std::pair<uint64, bool> CodedInputStream::ReadVarint64Fallback() {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    uint64 temp;
    ::std::pair<bool, const uint8*> p = ReadVarint64FromArray(buffer_, &temp);
    if (!p.first) {
      return std::make_pair(0, false);
    }
    buffer_ = p.second;
    return std::make_pair(temp, true);
  } else {
    uint64 temp;
    bool success = ReadVarint64Slow(&temp);
    return std::make_pair(temp, success);
  }
}